

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

int append_to_zip(FILE *zip_file,file_sorted_t *filep,FILE *ozip,BYTE *odir)

{
  uint uVar1;
  uint uVar2;
  file_entry_t *file_00;
  FILE *__stream;
  uint uVar3;
  uint uVar4;
  int iVar5;
  tm *time;
  FILE *__stream_00;
  int *piVar6;
  char *pcVar7;
  ulong uVar8;
  Byte *__ptr;
  size_t sVar9;
  undefined8 uVar10;
  CentralDirectoryEntry *ent;
  void *__ptr_00;
  void *__ptr_01;
  long lVar11;
  CentralDirectoryEntry *dirent;
  tm *ltime;
  int i;
  uint len;
  uint readlen;
  FILE *lumpfile;
  int slot;
  int best;
  int method [2];
  int offset [2];
  uint comp_len [2];
  Byte *compbuf [2];
  Byte *readbuf;
  file_entry_t *file;
  uLong crc;
  undefined2 local_48;
  LocalFileHeader local;
  BYTE *odir_local;
  FILE *ozip_local;
  file_sorted_t *filep_local;
  FILE *zip_file_local;
  
  file_00 = filep->file;
  local._22_8_ = odir;
  time = localtime(&file_00->time_write);
  time_to_dos((tm *)time,&file_00->date,&file_00->time);
  __stream_00 = fopen(&file_00->field_0x26,"rb");
  __stream = _stderr;
  if (__stream_00 == (FILE *)0x0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    fprintf(__stream,"Could not open %s: %s\n",&file_00->field_0x26,pcVar7);
    return 1;
  }
  fseek(__stream_00,0,2);
  uVar8 = ftell(__stream_00);
  uVar3 = (uint)uVar8;
  fseek(__stream_00,0,0);
  __ptr = (Byte *)malloc(uVar8 & 0xffffffff);
  if (__ptr == (Byte *)0x0) {
    fclose(__stream_00);
    fprintf(_stderr,"Could not allocate %u bytes\n",uVar8 & 0xffffffff);
    return 1;
  }
  sVar9 = fread(__ptr,1,uVar8 & 0xffffffff,__stream_00);
  fclose(__stream_00);
  if ((uint)sVar9 != uVar3) {
    free(__ptr);
    fprintf(_stderr,"Unable to read %s\n",&file_00->field_0x26);
    return 1;
  }
  file_00->uncompressed_size = uVar3;
  file_00->compressed_size = uVar3;
  file_00->method = 0;
  uVar10 = crc32(0,0,0);
  uVar4 = crc32(uVar10,__ptr,uVar8 & 0xffffffff);
  file_00->crc32 = uVar4;
  if (((local._22_8_ != 0) && (ozip != (FILE *)0x0)) &&
     (ent = find_file_in_zip((BYTE *)local._22_8_,filep->path_in_zip,uVar3,uVar4,file_00->date,
                             file_00->time), ent != (CentralDirectoryEntry *)0x0)) {
    iVar5 = copy_zip_file(zip_file,file_00,ozip,ent);
    if (0 < iVar5) {
      free(__ptr);
      return 0;
    }
    if (iVar5 < 0) {
      free(__ptr);
      fprintf(_stderr,"Unable to write %s to zip\n",&file_00->field_0x26);
      return 1;
    }
  }
  if (Quiet == 0) {
    if (ozip == (FILE *)0x0) {
      printf("Adding %-40s",filep->path_in_zip);
    }
    else {
      printf("Updating %-40s",filep->path_in_zip);
    }
  }
  UpdateCount = UpdateCount + 1;
  __ptr_00 = malloc((ulong)(uVar3 - 1));
  __ptr_01 = malloc((ulong)(uVar3 - 1));
  lumpfile._4_4_ = 0xffffffff;
  lumpfile._0_4_ = 0;
  ltime._4_4_ = 0;
  while (Compressors[ltime._4_4_].compress != (_func_int_Byte_ptr_uint_ptr_Byte_ptr_uint *)0x0) {
    if ((DeflateOnly == 0) || (Compressors[ltime._4_4_].method == 8)) {
      offset[(int)(uint)lumpfile] = uVar3 - 1;
      (&slot)[(int)(uint)lumpfile] = Compressors[ltime._4_4_].method;
      iVar5 = (*Compressors[ltime._4_4_].compress)
                        (compbuf[(long)(int)(uint)lumpfile + -1],
                         (uint *)(offset + (int)(uint)lumpfile),__ptr,uVar3);
      method[(int)(uint)lumpfile] = iVar5;
      if ((-1 < method[(int)(uint)lumpfile]) &&
         (((int)lumpfile._4_4_ < 0 ||
          ((uint)offset[(int)(uint)lumpfile] <= (uint)offset[(int)lumpfile._4_4_])))) {
        lumpfile._4_4_ = (uint)lumpfile;
        lumpfile._0_4_ = (uint)lumpfile ^ 1;
      }
    }
    ltime._4_4_ = ltime._4_4_ + 1;
  }
  if (-1 < (int)lumpfile._4_4_) {
    file_00->method = (short)(&slot)[(int)lumpfile._4_4_];
    file_00->compressed_size = offset[(int)lumpfile._4_4_];
  }
  crc._2_4_ = 0x4034b50;
  iVar5 = method_to_version((int)file_00->method);
  crc._6_1_ = (undefined1)iVar5;
  crc._7_1_ = 0;
  local_48 = 0;
  if (file_00->method == 8) {
    local_48 = 2;
  }
  local.Magic._0_2_ = file_00->method;
  local.Magic._2_2_ = file_00->time;
  local.VersionToExtract = (BYTE  [2])file_00->date;
  local._6_4_ = file_00->crc32;
  local.CRC32 = file_00->uncompressed_size;
  local._10_4_ = file_00->compressed_size;
  sVar9 = strlen(filep->path_in_zip);
  local.CompressedSize._0_2_ = (undefined2)sVar9;
  local.CompressedSize._2_2_ = 0;
  lVar11 = ftell((FILE *)zip_file);
  file_00->zip_offset = (uint)lVar11;
  sVar9 = fwrite((void *)((long)&crc + 2),0x1e,1,(FILE *)zip_file);
  if (sVar9 == 1) {
    pcVar7 = filep->path_in_zip;
    sVar9 = strlen(filep->path_in_zip);
    sVar9 = fwrite(pcVar7,sVar9,1,(FILE *)zip_file);
    if (sVar9 == 1) {
      if (file_00->method == 0) {
        sVar9 = fwrite(__ptr,1,uVar8 & 0xffffffff,(FILE *)zip_file);
        if (sVar9 == (uVar8 & 0xffffffff)) goto LAB_00104850;
      }
      else {
        sVar9 = fwrite(compbuf[(long)(int)lumpfile._4_4_ + -1] + method[(int)lumpfile._4_4_],1,
                       (ulong)(uint)offset[(int)lumpfile._4_4_],(FILE *)zip_file);
        if (sVar9 == (uint)offset[(int)lumpfile._4_4_]) {
LAB_00104850:
          free(__ptr);
          if (__ptr_00 != (void *)0x0) {
            free(__ptr_00);
          }
          if (__ptr_01 != (void *)0x0) {
            free(__ptr_01);
          }
          if (Quiet == 0) {
            uVar3 = file_00->uncompressed_size;
            uVar4 = file_00->compressed_size;
            uVar1 = file_00->compressed_size;
            uVar2 = file_00->uncompressed_size;
            pcVar7 = method_name((int)file_00->method);
            printf("%5.1f%% [%6u/%6u] %s\n",100.0 - ((double)uVar4 * 100.0) / (double)uVar3,
                   (ulong)uVar1,(ulong)uVar2,pcVar7);
          }
          return 0;
        }
      }
    }
  }
  if (Quiet == 0) {
    printf("\n");
  }
  fprintf(_stderr,"Unable to write %s to zip\n",&file_00->field_0x26);
  free(__ptr);
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  if (__ptr_01 != (void *)0x0) {
    free(__ptr_01);
  }
  return 1;
}

Assistant:

int append_to_zip(FILE *zip_file, file_sorted_t *filep, FILE *ozip, BYTE *odir)
{
	LocalFileHeader local;
	uLong crc;
	file_entry_t *file;
	Byte *readbuf;
	Byte *compbuf[2];
	unsigned int comp_len[2];
	int offset[2];
	int method[2];
	int best;
	int slot;
	FILE *lumpfile;
	unsigned int readlen;
	unsigned int len;
	int i;
	struct tm *ltime;

	file = filep->file;

	// try to determine local time
	ltime = localtime(&file->time_write);
	time_to_dos(ltime, &file->date, &file->time);

	// lumpfile = source file
	lumpfile = fopen(file->path, "rb");
	if (lumpfile == NULL)
	{
		fprintf(stderr, "Could not open %s: %s\n", file->path, strerror(errno));
		return 1;
	}
	// len = source size
	fseek (lumpfile, 0, SEEK_END);
	len = ftell(lumpfile);
	fseek (lumpfile, 0, SEEK_SET);

	// allocate a buffer for the whole source file
	readbuf = malloc(len);
	if (readbuf == NULL)
	{
		fclose(lumpfile);
		fprintf(stderr, "Could not allocate %u bytes\n", (int)len);
		return 1;
	}
	// read the whole source file into buffer
	readlen = (unsigned int)fread(readbuf, 1, len, lumpfile);
	fclose(lumpfile);

	// if read less bytes than expected, 
	if (readlen != len)
	{
		// diagnose and return error
		free(readbuf);
		fprintf(stderr, "Unable to read %s\n", file->path);
		return 1;
	}
	// file loaded

	file->uncompressed_size = len;
	file->compressed_size = len;
	file->method = METHOD_STORED;

	// Calculate CRC32 for file.
	crc = crc32(0, NULL, 0);
	crc = crc32(crc, readbuf, (uInt)len);
	file->crc32 = LittleLong(crc);

	// Can we save time and just copy the file from the old zip?
	if (odir != NULL && ozip != NULL)
	{
		CentralDirectoryEntry *dirent;

		dirent = find_file_in_zip(odir, filep->path_in_zip, len, crc, file->date, file->time);
		if (dirent != NULL)
		{
			i = copy_zip_file(zip_file, file, ozip, dirent);
			if (i > 0)
			{
				free(readbuf);
				return 0;
			}
			if (i < 0)
			{
				free(readbuf);
				fprintf(stderr, "Unable to write %s to zip\n", file->path);
				return 1;
			}
		}
	}

	if (!Quiet)
	{
		if (ozip != NULL)
		{
			printf("Updating %-40s", filep->path_in_zip);
		}
		else
		{
			printf("Adding %-40s", filep->path_in_zip);
		}
	}
	UpdateCount++;

	// Allocate a buffer for compression, one byte less than the source buffer.
	// If it doesn't fit in that space, then skip compression and store it as-is.
	compbuf[0] = malloc(len - 1);
	compbuf[1] = malloc(len - 1);
	best = -1;	// best slot
	slot = 0;	// slot we are compressing to now

	// Find best compression method. We have two output buffers. One to hold the
	// best compression method, and the other to hold the compression we are trying
	// now.
	for (i = 0; Compressors[i].compress != NULL; ++i)
	{
		if (DeflateOnly && Compressors[i].method != METHOD_DEFLATE)
		{
			continue;
		}
		comp_len[slot] = len - 1;
		method[slot] = Compressors[i].method;
		offset[slot] = Compressors[i].compress(compbuf[slot], &comp_len[slot], readbuf, len);
		if (offset[slot] >= 0)
		{
			if (best < 0 || comp_len[slot] <= comp_len[best])
			{
				best = slot;
				slot ^= 1;
			}
		}
	}

	if (best >= 0)
	{
		file->method = method[best];
		file->compressed_size = comp_len[best];
	}
//	printf("%s -> method %d -> slot %d\n", filep->path_in_zip, file->method, best);

	// Fill in local directory header.
	local.Magic = ZIP_LOCALFILE;
	local.VersionToExtract[0] = method_to_version(file->method);
	local.VersionToExtract[1] = 0;
	local.Flags = file->method == METHOD_DEFLATE ? LittleShort(2) : 0;
	local.Method = LittleShort(file->method);
	local.ModTime = file->time;
	local.ModDate = file->date;
	local.CRC32 = file->crc32;
	local.UncompressedSize = LittleLong(file->uncompressed_size);
	local.CompressedSize = LittleLong(file->compressed_size);
	local.NameLength = LittleShort((unsigned short)strlen(filep->path_in_zip));
	local.ExtraLength = 0;

	file->zip_offset = ftell(zip_file);

	// Write out the header, file name, and file data.
	if (fwrite(&local, sizeof(local), 1, zip_file) != 1 ||
		fwrite(filep->path_in_zip, strlen(filep->path_in_zip), 1, zip_file) != 1 ||
		(file->method ? fwrite(compbuf[best] + offset[best], 1, comp_len[best], zip_file) != comp_len[best] :
						fwrite(readbuf, 1, len, zip_file) != len))
	{
		if (!Quiet)
		{
			printf("\n");
		}
		fprintf(stderr, "Unable to write %s to zip\n", file->path);
		free(readbuf);
		if (compbuf[0] != NULL)
		{
			free(compbuf[0]);
		}
		if (compbuf[1] != NULL)
		{
			free(compbuf[1]);
		}
		return 1;
	}

	// all done
	free(readbuf);
	if (compbuf[0] != NULL)
	{
		free(compbuf[0]);
	}
	if (compbuf[1] != NULL)
	{
		free(compbuf[1]);
	}
	if (!Quiet)
	{
		printf("%5.1f%% [%6u/%6u] %s\n", 100.0 - 100.0 * file->compressed_size / file->uncompressed_size,
			file->compressed_size, file->uncompressed_size, method_name(file->method));
	}
	return 0;
}